

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_fstat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen handle)

{
  int iVar1;
  int status;
  int fd;
  stat st;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen handle_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)(srv + -6);
  iVar1 = uss_lookup_fd((UnixSftpServer *)st.__glibc_reserved[2],reply,handle);
  if (-1 < iVar1) {
    iVar1 = fstat(iVar1,(stat *)&status);
    if (iVar1 < 0) {
      uss_error((UnixSftpServer *)st.__glibc_reserved[2],reply);
    }
    else {
      uss_reply_struct_stat(reply,(stat *)&status);
    }
  }
  return;
}

Assistant:

static void uss_fstat(SftpServer *srv, SftpReplyBuilder *reply,
                      ptrlen handle)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    struct stat st;
    int fd;

    if ((fd = uss_lookup_fd(uss, reply, handle)) < 0)
        return;
    int status = fstat(fd, &st);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        uss_reply_struct_stat(reply, &st);
    }
}